

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getConvertMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr title;
  StringPtr title_00;
  StringPtr title_01;
  StringPtr version;
  MainFunc MVar2;
  StringPtr briefDescription;
  StringPtr helpText_00;
  StringPtr argumentTitle;
  StringPtr helpText_01;
  MainBuilder builder;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_148;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_138;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_128;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_118;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_108;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_f8;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_e8;
  OptionName local_d8;
  char *local_c8;
  undefined8 uStack_c0;
  OptionName local_b8;
  OptionName local_a8;
  char *local_98;
  undefined8 uStack_90;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30)>
  local_88;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41)>
  local_78;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48)>
  local_68;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38)>
  local_58;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34)>
  local_48;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48)>
  local_38;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34)>
  local_28;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_98 = "";
  uStack_90 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x2eb;
  briefDescription.content.ptr =
       "Converts messages between formats. Reads a stream of messages from stdin in format <from> and writes them to stdout in format <to>. Valid formats are:\n    binary      standard binary format\n    packed      packed binary format (deflates zeroes)\n    flat        binary single segment, no segment table (rare)\n    flat-packed flat and packed\n    canonical   canonicalized binary single segment, no segment table\n    text        schema language struct literal format\n    json        JSON format\nWhen using \"text\" or \"json\" format, you must specify <schema-file> and <type> (but they are ignored and can be omitted for binary-to-binary conversions). <type> names names a struct type defined in <schema-file>, which is the root type of the message(s)."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  local_a8.isLong = true;
  local_a8.field_1.longName = "short";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_e8,&local_28);
  names._M_len = 1;
  names._M_array = &local_a8;
  helpText_00.content.size_ = 0x93;
  helpText_00.content.ptr =
       "Write text or JSON output in short (non-pretty) format. Each message will be printed on one line, without using whitespace to improve readability."
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (&builder,names,(Function<kj::MainBuilder::Validity_()> *)&local_e8,helpText_00
                     );
  local_b8.isLong = true;
  local_b8.field_1.longName = "segment-size";
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_f8,&local_38);
  local_c8 = 
  "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  uStack_c0 = 0xe4;
  helpText.content.size_ = 0xe4;
  helpText.content.ptr =
       "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  names_00._M_len = 1;
  names_00._M_array = &local_b8;
  argumentTitle.content.size_ = 4;
  argumentTitle.content.ptr = "<n>";
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names_00,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_f8,argumentTitle
                      ,helpText);
  local_d8.isLong = true;
  local_d8.field_1.longName = "quiet";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_108,&local_48);
  names_01._M_len = 1;
  names_01._M_array = &local_d8;
  helpText_01.content.size_ = 0xa5;
  helpText_01.content.ptr =
       "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_01,(Function<kj::MainBuilder::Validity_()> *)&local_108,
                      helpText_01);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_118,&local_58);
  title.content.size_ = 0xc;
  title.content.ptr = "<from>:<to>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_118
                     );
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_128,&local_68);
  title_00.content.size_ = 0xe;
  title_00.content.ptr = "<schema-file>";
  pMVar1 = kj::MainBuilder::expectOptionalArg
                     (pMVar1,title_00,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_128);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_138,&local_78);
  title_01.content.size_ = 7;
  title_01.content.ptr = "<type>";
  pMVar1 = kj::MainBuilder::expectOptionalArg
                     (pMVar1,title_01,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_138);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_148,&local_88);
  kj::MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_148);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_148);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_138);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_128);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_118);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_108);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_f8);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_e8);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&builder);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getConvertMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Converts messages between formats. Reads a stream of messages from stdin in format "
          "<from> and writes them to stdout in format <to>. Valid formats are:\n"
          "    binary      standard binary format\n"
          "    packed      packed binary format (deflates zeroes)\n"
          "    flat        binary single segment, no segment table (rare)\n"
          "    flat-packed flat and packed\n"
          "    canonical   canonicalized binary single segment, no segment table\n"
          "    text        schema language struct literal format\n"
          "    json        JSON format\n"
          "When using \"text\" or \"json\" format, you must specify <schema-file> and <type> "
          "(but they are ignored and can be omitted for binary-to-binary conversions). "
          "<type> names names a struct type defined in <schema-file>, which is the root type "
          "of the message(s).");
    addGlobalOptions(builder);
    builder.addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
               "Write text or JSON output in short (non-pretty) format. Each message will "
               "be printed on one line, without using whitespace to improve readability.")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
               "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> "
               "words and turns off heuristic growth.  This flag is mainly useful "
               "for testing.  Without it, each message will be written as a single "
               "segment.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
               "Do not print warning messages about the input being in the wrong format.  "
               "Use this if you find the warnings are wrong (but also let us know so "
               "we can improve them).")
           .expectArg("<from>:<to>", KJ_BIND_METHOD(*this, setConversion))
           .expectOptionalArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectOptionalArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, convert));
    return builder.build();
  }